

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O1

void info_print_snode(lyout *out,lys_node *parent,lys_node *node,char *label)

{
  size_t sVar1;
  lys_node *plVar2;
  lys_node *plVar3;
  char *pcVar4;
  char *format;
  
  sVar1 = strlen(label);
  if (9 < sVar1) {
    __assert_fail("strlen(label) < INDENT_LEN-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_info.c"
                  ,0x43,
                  "void info_print_snode(struct lyout *, const struct lys_node *, const struct lys_node *, const char *)"
                 );
  }
  ly_print(out,"%-*s",0xb,label);
  if (node != (lys_node *)0x0) {
    pcVar4 = "output";
    if (node->name == (char *)0x0) {
      if (node->nodetype == LYS_INPUT) {
        pcVar4 = "input";
      }
      format = "%s\n";
    }
    else {
      pcVar4 = strnodetype(node->nodetype);
      ly_print(out,"%s \"",pcVar4);
      plVar2 = lys_parent(node);
      if (plVar2 != parent) {
        ly_print(out,"%s:",node->module->prefix);
      }
      pcVar4 = node->name;
      format = "%s\"\n";
    }
    ly_print(out,format,pcVar4);
    for (plVar2 = node->next; plVar2 != (lys_node *)0x0; plVar2 = plVar2->next) {
      if (plVar2->name == (char *)0x0) {
        pcVar4 = "output";
        if (plVar2->nodetype == LYS_INPUT) {
          pcVar4 = "input";
        }
        ly_print(out,"%*s%s\n",0xb,"",pcVar4);
      }
      else {
        pcVar4 = strnodetype(plVar2->nodetype);
        ly_print(out,"%*s%s \"",0xb,"",pcVar4);
        plVar3 = lys_parent(plVar2);
        if (plVar3 != parent) {
          ly_print(out,"%s:",plVar2->module->prefix);
        }
        ly_print(out,"%s\"\n",plVar2->name);
      }
    }
    return;
  }
  ly_print(out,"\n");
  return;
}

Assistant:

static void
info_print_snode(struct lyout *out, const struct lys_node *parent, const struct lys_node *node, const char *label)
{
    assert(strlen(label) < INDENT_LEN-1);

    ly_print(out, "%-*s", INDENT_LEN, label);

    if (node) {
        if (node->name) {
            ly_print(out, "%s \"", strnodetype(node->nodetype));
            if (parent != lys_parent(node)) {
                ly_print(out, "%s:", node->module->prefix);
            }
            ly_print(out, "%s\"\n", node->name);
        } else {
            ly_print(out, "%s\n", (node->nodetype == LYS_INPUT ? "input" : "output"));
        }
        node = node->next;
        for (; node; node = node->next) {
            if (node->name) {
                ly_print(out, "%*s%s \"", INDENT_LEN, "", strnodetype(node->nodetype));
                if (parent != lys_parent(node)) {
                    ly_print(out, "%s:", node->module->prefix);
                }
                ly_print(out, "%s\"\n", node->name);
            } else {
                ly_print(out, "%*s%s\n", INDENT_LEN, "", (node->nodetype == LYS_INPUT ? "input" : "output"));
            }
        }
    } else {
        ly_print(out, "\n");
    }
}